

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztetrahedron.cpp
# Opt level: O2

TPZTransform<double> *
pztopology::TPZTetrahedron::SideToSideTransform
          (TPZTransform<double> *__return_storage_ptr__,int sidefrom,int sideto)

{
  double dVar1;
  uint col;
  uint row;
  ostream *poVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong col_00;
  double *pdVar7;
  int dim;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if ((uint)sidefrom < 0xf && (uint)sideto < 0xf) {
    lVar3 = (long)sidefrom;
    if (sidefrom == sideto) {
      dim = *(int *)(sidedimension + lVar3 * 4);
      goto LAB_00e2a5c9;
    }
    if (sidefrom == 0xe) {
      TransformElementToSide(__return_storage_ptr__,sideto);
      return __return_storage_ptr__;
    }
    uVar6 = (ulong)*(uint *)(nhighdimsides + lVar3 * 4);
    if ((int)*(uint *)(nhighdimsides + lVar3 * 4) < 1) {
      uVar6 = 0;
    }
    uVar10 = 0;
    pdVar5 = (double *)(sidetosidetransforms + lVar3 * 0x2a0);
    while (pdVar7 = pdVar5, uVar9 = uVar10, uVar9 != uVar6) {
      uVar10 = uVar9 + 1;
      pdVar5 = pdVar7 + 0xc;
      if (*(int *)(pztopology::highsides + uVar9 * 4 + lVar3 * 0x1c) == sideto) {
        col = *(uint *)(sidedimension + lVar3 * 4);
        row = *(uint *)(sidedimension + (long)sideto * 4);
        TPZTransform<double>::TPZTransform(__return_storage_ptr__,row,col);
        uVar10 = 0;
        uVar6 = (ulong)col;
        if ((int)col < 1) {
          uVar6 = uVar10;
        }
        uVar11 = (ulong)row;
        if ((int)row < 1) {
          uVar11 = uVar10;
        }
        for (; uVar10 != uVar11; uVar10 = uVar10 + 1) {
          pdVar5 = pdVar7;
          for (col_00 = 0; uVar6 != col_00; col_00 = col_00 + 1) {
            dVar1 = *pdVar5;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&(__return_storage_ptr__->fMult).super_TPZFMatrix<double>,uVar10,
                                col_00);
            *pdVar4 = dVar1;
            pdVar5 = pdVar5 + 3;
          }
          dVar1 = *(double *)(uVar9 * 0x60 + lVar3 * 0x2a0 + 0x12fbf08 + uVar10 * 8);
          pdVar5 = TPZFMatrix<double>::operator()
                             (&(__return_storage_ptr__->fSum).super_TPZFMatrix<double>,uVar10,0);
          *pdVar5 = dVar1;
          pdVar7 = pdVar7 + 1;
        }
        return __return_storage_ptr__;
      }
    }
    pcVar8 = "TPZTetrahedron::SideToSideTransform highside not found sidefrom ";
  }
  else {
    pcVar8 = "TPZTetrahedron::HigherDimensionSides sidefrom ";
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sidefrom);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sideto);
  std::endl<char,std::char_traits<char>>(poVar2);
  dim = 0;
LAB_00e2a5c9:
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,dim);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<> TPZTetrahedron::SideToSideTransform(int sidefrom, int sideto)
	{
		if(sidefrom <0 || sidefrom >= NSides || sideto <0 || sideto >= NSides) {
			PZError << "TPZTetrahedron::HigherDimensionSides sidefrom "<< sidefrom << 
			' ' << sideto << endl;
			return TPZTransform<>(0);
		}
		if(sidefrom == sideto) {
			return TPZTransform<>(sidedimension[sidefrom]);
		}
		if(sidefrom == NSides-1) {
			return TransformElementToSide(sideto);
		}
		int nhigh = nhighdimsides[sidefrom];
		int is;
		for(is=0; is<nhigh; is++) {
			if(highsides[sidefrom][is] == sideto) {
				int dfr = sidedimension[sidefrom];
				int dto = sidedimension[sideto];
				TPZTransform<> trans(dto,dfr);
				int i,j;
				for(i=0; i<dto; i++) {
					for(j=0; j<dfr; j++) {
						trans.Mult()(i,j) = sidetosidetransforms[sidefrom][is][j][i];
					}
					trans.Sum()(i,0) = sidetosidetransforms[sidefrom][is][3][i];
				}
				return trans;
			}
		}
		PZError << "TPZTetrahedron::SideToSideTransform highside not found sidefrom "
		<< sidefrom << ' ' << sideto << endl;
		return TPZTransform<>(0);
	}